

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppAssertTest.cpp
# Opt level: O3

void __thiscall
CppAssertTest_formatStatementAssertion_Test::TestBody
          (CppAssertTest_formatStatementAssertion_Test *this)

{
  bool bVar1;
  char *message;
  AssertionResult gtest_ar;
  Message local_50;
  AssertHelper local_48;
  internal local_40 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  string local_30;
  
  cppassert::DefaultFormatter::formatStatementFailureMessage_abi_cxx11_
            (&local_30,(DefaultFormatter *)(this->super_CppAssertTest).cppAssert_,(char *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  local_50.ss_.ptr_._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            (local_40,"1","formatStatementCounter_",(int *)&local_50,
             &(this->super_CppAssertTest).formatStatementCounter_);
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message(&local_50);
    if (local_38.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_38.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/DariuszOstolski[P]cppassert/tests/CppAssertTest.cpp"
               ,0x9f,message);
    testing::internal::AssertHelper::operator=(&local_48,&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if (CONCAT44(local_50.ss_.ptr_._4_4_,local_50.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_50.ss_.ptr_._4_4_,local_50.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_50.ss_.ptr_._4_4_,local_50.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST_F(CppAssertTest, formatStatementAssertion)
{
    cppAssert_->formatStatementFailureMessage(nullptr);
    EXPECT_EQ(1, formatStatementCounter_);
}